

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlChar * xmlNodeGetLang(xmlNode *cur)

{
  xmlChar *pxVar1;
  
  if ((cur == (xmlNode *)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    while ((pxVar1 = (xmlChar *)0x0, cur != (xmlNode *)0x0 &&
           (pxVar1 = xmlGetNsProp(cur,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace"),
           pxVar1 == (xmlChar *)0x0))) {
      cur = cur->parent;
    }
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlNodeGetLang(const xmlNode *cur) {
    xmlChar *lang;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    while (cur != NULL) {
        lang = xmlGetNsProp(cur, BAD_CAST "lang", XML_XML_NAMESPACE);
	if (lang != NULL)
	    return(lang);
	cur = cur->parent;
    }
    return(NULL);
}